

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  IStreamingReporter *pIVar1;
  ulong uVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer ppIVar5;
  int iVar6;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  int local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  size_t local_40;
  undefined1 local_38;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_0025e620;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__RunContext_0025e6e0;
  pIVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  uVar2 = (this->m_totals).assertions.failed;
  iVar6 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  pcVar3 = (this->m_runInfo).name._M_dataplus._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar3,pcVar3 + (this->m_runInfo).name._M_string_length);
  local_38 = (ulong)(long)iVar6 <= uVar2;
  local_40 = (this->m_totals).testCases.failedButOk;
  local_70 = (this->m_totals).error;
  uStack_6c = *(undefined4 *)&(this->m_totals).field_0x4;
  uStack_68 = (undefined4)(this->m_totals).assertions.passed;
  uStack_64 = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  local_60 = (undefined4)(this->m_totals).assertions.failed;
  uStack_5c = *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  uStack_58 = (undefined4)(this->m_totals).assertions.failedButOk;
  uStack_54 = *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  local_50 = (undefined4)(this->m_totals).testCases.passed;
  uStack_4c = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  uStack_48 = (undefined4)(this->m_totals).testCases.failed;
  uStack_44 = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  (*pIVar1->_vptr_IStreamingReporter[0xe])(pIVar1);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (altStackMem != (void *)0x0) {
    operator_delete__(altStackMem);
  }
  altStackMem = (void *)0x0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->m_trackerContext).m_rootTracker.
           super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  ppIVar5 = (this->m_activeSections).
            super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar5 != (pointer)0x0) {
    operator_delete(ppIVar5);
  }
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            (&this->m_unfinishedSections);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::~vector
            (&this->m_messageScopes);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->m_messages);
  pIVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  if (pIVar1 != (IStreamingReporter *)0x0) {
    (*pIVar1->_vptr_IStreamingReporter[1])();
  }
  (this->m_reporter)._M_t.
  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>.
  _M_t.
  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
       (IStreamingReporter *)0x0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  Option<Catch::AssertionResult>::reset(&this->m_lastResult);
  pcVar3 = (this->m_runInfo).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->m_runInfo).name.field_2) {
    operator_delete(pcVar3);
  }
  return;
}

Assistant:

RunContext::~RunContext() {
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, aborting()));
    }